

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

ErrorType __thiscall
Network::Client::ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
          (ImplBase<Network::Client::MQTTv5::Impl> *this,ControlPacketSerializable *packet,
          bool withAnswer,bool isPublish)

{
  _func_int *p_Var1;
  PacketStorage *pPVar2;
  bool withAnswer_00;
  undefined1 *puVar3;
  ImplBase<Network::Client::MQTTv5::Impl> *this_00;
  uint packetSize;
  uint uVar4;
  int iVar5;
  ErrorType EVar6;
  uint8 *puVar7;
  ulong uVar8;
  byte bVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  undefined ***pppuVar11;
  uint uVar12;
  undefined **local_118;
  _func_int **local_110;
  undefined **local_108;
  undefined4 local_100;
  undefined2 local_fc;
  _func_int **local_f8;
  _func_int **pp_Stack_f0;
  _func_int **local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined **local_d0;
  _func_int **local_c8;
  undefined **local_c0;
  undefined **local_b8;
  _func_int **local_b0;
  undefined2 local_a8;
  ushort local_a6;
  undefined **local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined **local_88;
  undefined **local_80;
  undefined4 local_78;
  undefined2 local_74;
  _func_int **local_70;
  _func_int **local_68;
  undefined **local_60;
  _func_int **local_58;
  undefined4 local_50;
  undefined4 local_44;
  undefined1 *local_40;
  ImplBase<Network::Client::MQTTv5::Impl> *local_38;
  
  pppuVar11 = &local_118;
  local_44 = (undefined4)CONCAT71(in_register_00000011,withAnswer);
  local_38 = this;
  packetSize = (*(packet->super_Serializable)._vptr_Serializable[3])(packet,1);
  uVar8 = (ulong)packetSize;
  if (packetSize < 0x201) {
    pppuVar11 = (undefined ***)((long)&local_118 - (uVar8 + 0xf & 0xfffffffffffffff0));
    local_40 = (undefined1 *)pppuVar11;
  }
  else {
    local_40 = (undefined1 *)malloc(uVar8);
  }
  uVar10 = -uVar8;
  if (0x200 < packetSize) {
    uVar10 = uVar8;
  }
  p_Var1 = (packet->super_Serializable)._vptr_Serializable[1];
  *(undefined8 *)((long)pppuVar11 + -8) = 0x11d0fb;
  uVar4 = (*p_Var1)(packet);
  puVar3 = local_40;
  EVar6.errorCode = -1;
  if (uVar4 != packetSize) goto LAB_0011d325;
  if (isPublish) {
    local_110 = packet[1].super_Serializable._vptr_Serializable;
    local_108 = &PTR_getSize_0012ecf0;
    local_100 = *(undefined4 *)&packet[3].super_Serializable._vptr_Serializable;
    local_fc = *(undefined2 *)((long)&packet[3].super_Serializable._vptr_Serializable + 4);
    local_f8 = packet[4].super_Serializable._vptr_Serializable;
    pp_Stack_f0 = packet[5].super_Serializable._vptr_Serializable;
    local_e8 = packet[6].super_Serializable._vptr_Serializable;
    local_118 = &PTR_getSize_0012f610;
    uVar4 = *(uint *)&packet[8].super_Serializable._vptr_Serializable;
    local_d8 = (undefined1)uVar4;
    local_e0 = &PTR_getType_0012f658;
    local_c0 = &PTR_getSize_0012ed30;
    local_b8 = &PTR_acceptBuffer_0012ed68;
    local_b0 = packet[0xd].super_Serializable._vptr_Serializable;
    local_a8 = *(undefined2 *)&packet[0xe].super_Serializable._vptr_Serializable;
    local_a6 = *(ushort *)((long)&packet[0xe].super_Serializable._vptr_Serializable + 2);
    uVar8 = (ulong)local_a6;
    local_c8 = packet[10].super_Serializable._vptr_Serializable;
    local_d0 = &PTR_getSize_0012f690;
    local_a0 = &PTR_typeSize_0012f710;
    local_98 = *(undefined4 *)&packet[0x10].super_Serializable._vptr_Serializable;
    uStack_94 = *(undefined4 *)((long)&packet[0x10].super_Serializable._vptr_Serializable + 4);
    uStack_90 = *(undefined4 *)&packet[0x11].super_Serializable._vptr_Serializable;
    uStack_8c = *(undefined4 *)((long)&packet[0x11].super_Serializable._vptr_Serializable + 4);
    local_88 = &PTR_getSize_0012f530;
    local_80 = &PTR_getSize_0012ecf0;
    local_78 = *(undefined4 *)&packet[0x14].super_Serializable._vptr_Serializable;
    local_74 = *(undefined2 *)((long)&packet[0x14].super_Serializable._vptr_Serializable + 4);
    local_70 = packet[0x15].super_Serializable._vptr_Serializable;
    local_60 = &PTR_getSize_0012ee80;
    local_58 = packet[0x18].super_Serializable._vptr_Serializable;
    local_50 = *(undefined4 *)&packet[0x19].super_Serializable._vptr_Serializable;
    uVar4 = uVar4 >> 1 & 3;
    local_68 = local_70;
    if (uVar4 != 0) {
      pPVar2 = local_38->storage;
      uVar12 = (uint)local_a6;
      p_Var1 = *pPVar2->_vptr_PacketStorage;
      *(undefined8 *)((long)pppuVar11 + -8) = 0x11d28d;
      iVar5 = (*p_Var1)(pPVar2,uVar8,puVar3);
      if ((char)iVar5 != '\0') {
        if (uVar4 == 2) {
          bVar9 = (local_38->buffers).maxID;
          if ((ulong)bVar9 != 0) {
            uVar12 = uVar12 | 0x80000000;
            puVar7 = (local_38->buffers).buffer;
            uVar8 = 0;
            do {
              if ((*(uint *)(puVar7 + uVar8 * 4) & 0x1ffff) == 0) goto LAB_0011d2fc;
              uVar8 = uVar8 + 1;
            } while (bVar9 != uVar8);
          }
        }
        else {
          if (uVar4 != 1) goto LAB_0011d307;
          bVar9 = (local_38->buffers).maxID;
          if ((ulong)bVar9 != 0) {
            puVar7 = (local_38->buffers).buffer;
            uVar8 = 0;
            do {
              if ((*(uint *)(puVar7 + uVar8 * 4) & 0x1ffff) == 0) goto LAB_0011d2fc;
              uVar8 = uVar8 + 1;
            } while (bVar9 != uVar8);
          }
        }
      }
LAB_0011d31f:
      EVar6.errorCode = -10;
      goto LAB_0011d325;
    }
  }
LAB_0011d307:
  this_00 = local_38;
  withAnswer_00 = local_44._0_1_;
  *(undefined8 *)((long)pppuVar11 + -8) = 0x11d31a;
  EVar6 = sendAndReceive(this_00,puVar3,packetSize,withAnswer_00);
LAB_0011d325:
  puVar3 = local_40;
  if (0 < (long)uVar10) {
    *(undefined8 *)((long)pppuVar11 + -8) = 0x11d333;
    free(puVar3);
  }
  return (ErrorType)EVar6.errorCode;
LAB_0011d2fc:
  if (bVar9 <= (byte)uVar8) goto LAB_0011d31f;
  *(uint *)(puVar7 + (uVar8 & 0xff) * 4) = uVar12;
  goto LAB_0011d307;
}

Assistant:

ErrorType prepareSAR(Protocol::MQTT::V5::ControlPacketSerializable & packet, bool withAnswer = true, bool isPublish = false)
        {
            // Ok, setting are done, let's build this packet now
            uint32 packetSize = packet.computePacketSize();
            DeclareStackHeapBuffer(buffer, packetSize, StackSizeAllocationLimit);
            if (packet.copyInto(buffer) != packetSize)
                return ErrorType::UnknownError;

#if MQTTQoSSupportLevel == -1
#else
            // Check for saving publish packet if required
            if (isPublish)
            {
                Protocol::MQTT::V5::PublishPacket publish = (Protocol::MQTT::V5::PublishPacket&)packet;
                uint8 QoS = publish.header.getQoS();
                if (QoS > 0) {
                    uint16 packetID = publish.fixedVariableHeader.packetID;
  #if MQTTQoSSupportLevel == 1
                    // Save packet
                    if (!storage->savePacketBuffer(packetID, buffer, packetSize))
                        return ErrorType::StorageError;
  #endif
                    // Save packet ID too
                    if ((QoS == 1 && !buffers.storeQoS1ID(packetID)) || (QoS == 2 && !buffers.storeQoS2ID(packetID)))
                        return ErrorType::StorageError;
                }
            }
#endif

    #if MQTTDumpCommunication == 1
    //      String out;
    //      packet.dump(out, 2);
    //      printf("Prepared:\n%s\n", (const char*)out);
    #endif
            return sendAndReceive(buffer, packetSize, withAnswer);
        }